

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_feature(lysp_yin_ctx *ctx,lysp_feature **features)

{
  lysp_feature *arg_val;
  LY_ERR ret___3;
  LY_ERR ret___2;
  yin_subelement subelems [5];
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_feature *feat;
  lysp_feature **features_local;
  lysp_yin_ctx *ctx_local;
  
  if (*features == (lysp_feature *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x48);
    if (_ret___1 == (undefined8 *)0x0) {
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_feature");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + 1;
    _ret___1 = (undefined8 *)
               realloc(&(*features)[-1].flags,*(long *)&(*features)[-1].flags * 0x40 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      *(long *)&(*features)[-1].flags = *(long *)&(*features)[-1].flags + -1;
      ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_feature");
      return LY_EMEM;
    }
  }
  *features = (lysp_feature *)(_ret___1 + 1);
  arg_val = *features + *(long *)&(*features)[-1].flags + -1;
  memset(arg_val,0,0x40);
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute(ctx,YIN_ARG_NAME,&arg_val->name,Y_IDENTIF_ARG,LY_STMT_FEATURE),
     ctx_local._4_4_ == LY_SUCCESS)) {
    ret___3 = 0x80000;
    subelems[0]._0_8_ = &arg_val->dsc;
    subelems[0].dest._0_2_ = 2;
    subelems[0].flags = 0;
    subelems[0]._18_2_ = 0x13;
    subelems[1]._0_8_ = &arg_val->iffeatures;
    subelems[1].dest._0_2_ = 0;
    subelems[1].flags = 0;
    subelems[1]._18_2_ = 0x27;
    subelems[2]._0_8_ = &arg_val->ref;
    subelems[2].dest._0_2_ = 2;
    subelems[2].flags = 0;
    subelems[2]._18_2_ = 0x2c;
    subelems[3]._0_8_ = &arg_val->flags;
    subelems[3].dest._0_2_ = 2;
    memset(&subelems[3].flags,0,0x18);
    subelems[3].flags = 0;
    subelems[3]._18_2_ = 0xf;
    ctx_local._4_4_ =
         yin_parse_content(ctx,(yin_subelement *)&ret___3,5,arg_val,LY_STMT_FEATURE,(char **)0x0,
                           &arg_val->exts);
    if ((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ = yin_unres_exts_add(ctx,arg_val->exts), ctx_local._4_4_ == LY_SUCCESS)) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_feature(struct lysp_yin_ctx *ctx, struct lysp_feature **features)
{
    struct lysp_feature *feat;

    /* allocate new feature */
    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *features, feat, LY_EMEM);

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &feat->name, Y_IDENTIF_ARG, LY_STMT_FEATURE));

    /* parse content */
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &feat->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_IF_FEATURE, &feat->iffeatures, 0},
        {LY_STMT_REFERENCE, &feat->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_STATUS, &feat->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), feat, LY_STMT_FEATURE, NULL, &feat->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, feat->exts));

    return LY_SUCCESS;
}